

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O0

void __thiscall
sentencepiece::unigram::Model::BuildTrie
          (Model *this,
          vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          *pieces)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  size_t *lengths;
  progress_func_type progress_func;
  size_type sVar5;
  reference pvVar6;
  const_pointer pvVar7;
  reference ppcVar8;
  reference pvVar9;
  result_pair_type *node_pos;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *in_RSI;
  long *in_RDI;
  int num_nodes;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *p;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *__range2;
  vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
  results;
  int kMaxTrieResultsSize;
  size_t i;
  vector<int,_std::allocator<int>_> value;
  vector<const_char_*,_std::allocator<const_char_*>_> key;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *in_stack_fffffffffffffdf8;
  __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>_>
  *in_stack_fffffffffffffe00;
  __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>_>
  in_stack_fffffffffffffe08;
  __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>_>
  in_stack_fffffffffffffe10;
  const_pointer in_stack_fffffffffffffe18;
  vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
  *in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe30;
  Status *in_stack_fffffffffffffe38;
  result_pair_type *results_00;
  Status *in_stack_fffffffffffffe40;
  Status *this_00;
  DoubleArrayImpl<void,_void,_int,_void> *this_01;
  value_type_conflict1 *values;
  key_type **keys;
  size_t in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  int local_104;
  reference local_100;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *local_f8;
  __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>_>
  local_f0;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *local_e8;
  undefined1 local_d9 [25];
  undefined4 local_c0;
  undefined4 local_bc;
  Status local_a0;
  ulong local_98;
  undefined1 local_89 [32];
  undefined1 local_69 [25];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *local_50;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *local_48;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *local_10;
  
  local_10 = in_RSI;
  (**(code **)(*in_RDI + 0x10))();
  bVar2 = util::Status::ok((Status *)0x48204d);
  bVar3 = bVar2 ^ 0xff;
  util::Status::~Status((Status *)0x482073);
  if ((bVar3 & 1) == 0) {
    bVar2 = std::
            vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
            ::empty((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                     *)in_stack_fffffffffffffe10._M_current);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&(in_stack_fffffffffffffe10._M_current)->first,
                 (char *)in_stack_fffffffffffffe08._M_current);
      str._M_str = in_stack_fffffffffffffe18;
      str._M_len = (size_t)in_stack_fffffffffffffe10._M_current;
      util::InternalError(str);
      util::Status::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      util::Status::~Status((Status *)0x482125);
    }
    else {
      local_48 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *)
                 std::
                 vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                 ::begin(in_stack_fffffffffffffdf8);
      local_50 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *)
                 std::
                 vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                 ::end(in_stack_fffffffffffffdf8);
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>>>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      lengths = (size_t *)
                std::
                vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                ::size(local_10);
      keys = (key_type **)local_69;
      std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x4821b9);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffe20,
                 (size_type)in_stack_fffffffffffffe18,
                 (allocator_type *)in_stack_fffffffffffffe10._M_current);
      std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x4821e5);
      progress_func =
           (progress_func_type)
           std::
           vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
           ::size(local_10);
      values = (value_type_conflict1 *)local_89;
      std::allocator<int>::allocator((allocator<int> *)0x48220f);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe20,
                 (size_type)in_stack_fffffffffffffe18,
                 (allocator_type *)in_stack_fffffffffffffe10._M_current);
      std::allocator<int>::~allocator((allocator<int> *)0x48223b);
      for (local_98 = 0; uVar1 = local_98,
          sVar5 = std::
                  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                  ::size(local_10), uVar1 < sVar5; local_98 = local_98 + 1) {
        pvVar6 = std::
                 vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                 ::operator[](local_10,local_98);
        pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::data(&pvVar6->first);
        ppcVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_69 + 1),
                             local_98);
        *ppcVar8 = pvVar7;
        pvVar6 = std::
                 vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                 ::operator[](local_10,local_98);
        iVar4 = pvVar6->second;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_89 + 1),local_98);
        *pvVar9 = iVar4;
      }
      std::make_unique<Darts::DoubleArrayImpl<void,void,int,void>>();
      this_01 = (DoubleArrayImpl<void,_void,_int,_void> *)(in_RDI + 0x14);
      this_00 = &local_a0;
      std::
      unique_ptr<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
      ::operator=((unique_ptr<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                   *)in_stack_fffffffffffffe00,
                  (unique_ptr<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                   *)in_stack_fffffffffffffdf8);
      std::
      unique_ptr<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
      ::~unique_ptr((unique_ptr<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                     *)in_stack_fffffffffffffe10._M_current);
      std::
      unique_ptr<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
      ::operator->((unique_ptr<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                    *)0x4823a8);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_69 + 1));
      std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_69 + 1),0);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(local_89 + 1),0);
      iVar4 = Darts::DoubleArrayImpl<void,_void,_int,_void>::build
                        ((DoubleArrayImpl<void,_void,_int,_void> *)
                         CONCAT17(bVar3,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8,keys,
                         lengths,values,progress_func);
      if (iVar4 == 0) {
        local_c0 = 0x400;
        results_00 = (result_pair_type *)local_d9;
        std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>::allocator
                  ((allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type> *)
                   0x4824f0);
        std::
        vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
        ::vector(in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18,
                 (allocator_type *)in_stack_fffffffffffffe10._M_current);
        std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>::~allocator
                  ((allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type> *)
                   0x482516);
        *(undefined4 *)(in_RDI + 0x15) = 0;
        local_e8 = local_10;
        local_f0._M_current =
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *)
             std::
             vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::begin(in_stack_fffffffffffffdf8);
        local_f8 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *)
                   std::
                   vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   ::end(in_stack_fffffffffffffdf8);
        while (bVar2 = __gnu_cxx::operator!=
                                 (in_stack_fffffffffffffe00,
                                  (__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>_>
                                   *)in_stack_fffffffffffffdf8), bVar2) {
          local_100 = __gnu_cxx::
                      __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>_>
                      ::operator*(&local_f0);
          in_stack_fffffffffffffe10._M_current =
               (pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *)
               std::
               unique_ptr<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
               ::operator->((unique_ptr<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                             *)0x4825a9);
          in_stack_fffffffffffffe18 =
               std::basic_string_view<char,_std::char_traits<char>_>::data(&local_100->first);
          in_stack_fffffffffffffe08._M_current =
               (pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *)(local_d9 + 1);
          node_pos = std::
                     vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                     ::data((vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                             *)0x4825d2);
          sVar5 = std::
                  vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                  ::size((vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                          *)in_stack_fffffffffffffe08._M_current);
          std::basic_string_view<char,_std::char_traits<char>_>::size(&local_100->first);
          in_stack_fffffffffffffe30 =
               Darts::DoubleArrayImpl<void,void,int,void>::
               commonPrefixSearch<Darts::DoubleArrayImpl<void,void,int,void>::result_pair_type>
                         (this_01,(key_type *)this_00,results_00,in_stack_fffffffffffffe30,sVar5,
                          (size_t)node_pos);
          local_104 = (int)in_stack_fffffffffffffe30;
          in_stack_fffffffffffffe00 =
               (__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>_>
                *)std::max<int>((int *)(in_RDI + 0x15),&local_104);
          *(int *)(in_RDI + 0x15) = *(int *)&in_stack_fffffffffffffe00->_M_current;
          __gnu_cxx::
          __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>_>
          ::operator++(&local_f0);
        }
        std::
        unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
        ::clear((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                 *)0x4826c1);
        if ((int)in_RDI[0x15] == 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&(in_stack_fffffffffffffe10._M_current)->first,
                     (char *)in_stack_fffffffffffffe08._M_current);
          str_01._M_str = in_stack_fffffffffffffe18;
          str_01._M_len = (size_t)in_stack_fffffffffffffe10._M_current;
          util::InternalError(str_01);
          util::Status::operator=(this_00,(Status *)results_00);
          util::Status::~Status((Status *)0x482734);
        }
        std::
        vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
        ::~vector((vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
                   *)in_stack_fffffffffffffe10._M_current);
        local_bc = 0;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&(in_stack_fffffffffffffe10._M_current)->first,
                   (char *)in_stack_fffffffffffffe08._M_current);
        str_00._M_str = in_stack_fffffffffffffe18;
        str_00._M_len = (size_t)in_stack_fffffffffffffe10._M_current;
        util::InternalError(str_00);
        util::Status::operator=(this_00,in_stack_fffffffffffffe38);
        util::Status::~Status((Status *)0x482484);
        local_bc = 1;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10._M_current);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                 in_stack_fffffffffffffe10._M_current);
    }
  }
  return;
}

Assistant:

void Model::BuildTrie(std::vector<std::pair<absl::string_view, int>> *pieces) {
  if (!status().ok()) return;

  if (pieces->empty()) {
    status_ = util::InternalError("no pieces are loaded.");
    return;
  }

  // sort by sentencepiece since DoubleArray::build()
  // only accepts sorted strings.
  sort(pieces->begin(), pieces->end());

  // Makes key/value set for DoubleArrayTrie.
  std::vector<const char *> key(pieces->size());
  std::vector<int> value(pieces->size());
  for (size_t i = 0; i < pieces->size(); ++i) {
    key[i] = (*pieces)[i].first.data();  // sorted piece.
    value[i] = (*pieces)[i].second;      // vocab_id
  }

  trie_ = std::make_unique<Darts::DoubleArray>();
  if (trie_->build(key.size(), const_cast<char **>(&key[0]), nullptr,
                   &value[0]) != 0) {
    status_ = util::InternalError("cannot build double-array.");
    return;
  }

  // Computes the maximum number of shared prefixes in the trie.
  const int kMaxTrieResultsSize = 1024;
  std::vector<Darts::DoubleArray::result_pair_type> results(
      kMaxTrieResultsSize);
  trie_results_size_ = 0;
  for (const auto &p : *pieces) {
    const int num_nodes = trie_->commonPrefixSearch(
        p.first.data(), results.data(), results.size(), p.first.size());
    trie_results_size_ = std::max(trie_results_size_, num_nodes);
  }

  pieces_.clear();

  if (trie_results_size_ == 0)
    status_ = util::InternalError("no entry is found in the trie.");
}